

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O0

int getMineshafts(int mc,uint64_t seed,int cx0,int cz0,int cx1,int cz1,Pos *out,int nout)

{
  int iVar1;
  int n_00;
  uint64_t uVar2;
  uint64_t *seed_00;
  uint64_t *seed_01;
  int in_ECX;
  int in_EDX;
  uint64_t in_RSI;
  int in_EDI;
  int in_R8D;
  int in_R9D;
  double dVar3;
  int d;
  uint64_t aix;
  int in_stack_00000010;
  int n;
  int j;
  int i;
  uint64_t b;
  uint64_t a;
  uint64_t s;
  int local_54;
  uint64_t *in_stack_ffffffffffffffb0;
  int local_44;
  int local_40;
  uint64_t local_28;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  uint64_t local_10;
  int local_4;
  
  local_20 = in_R9D;
  local_1c = in_R8D;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_4 = in_EDI;
  setSeed(&local_28,in_RSI);
  uVar2 = nextLong(in_stack_ffffffffffffffb0);
  seed_00 = (uint64_t *)nextLong(in_stack_ffffffffffffffb0);
  local_44 = 0;
  for (n_00 = local_14; n_00 <= local_1c; n_00 = n_00 + 1) {
    seed_01 = (uint64_t *)((long)n_00 * uVar2 ^ local_10);
    for (local_40 = local_18; local_40 <= local_20; local_40 = local_40 + 1) {
      setSeed(&local_28,(ulong)seed_01 ^ (long)local_40 * (long)seed_00);
      if (local_4 < 0x10) {
        skipNextN(&local_28,1);
        dVar3 = nextDouble(seed_01);
        if (dVar3 < 0.004) {
          local_54 = n_00;
          if (n_00 < -n_00) {
            local_54 = -n_00;
          }
          if (local_54 < local_40) {
            local_54 = local_40;
          }
          if (local_54 < -local_40) {
            local_54 = -local_40;
          }
          if ((0x4f < local_54) || (iVar1 = nextInt(seed_00,n_00), iVar1 < local_54)) {
            if ((aix != 0) && (local_44 < in_stack_00000010)) {
              *(int *)(aix + (long)local_44 * 8) = n_00 << 4;
              *(int *)(aix + 4 + (long)local_44 * 8) = local_40 << 4;
            }
            local_44 = local_44 + 1;
          }
        }
      }
      else {
        dVar3 = nextDouble(seed_01);
        if (dVar3 < 0.004) {
          if ((aix != 0) && (local_44 < in_stack_00000010)) {
            *(int *)(aix + (long)local_44 * 8) = n_00 << 4;
            *(int *)(aix + 4 + (long)local_44 * 8) = local_40 << 4;
          }
          local_44 = local_44 + 1;
        }
      }
    }
  }
  return local_44;
}

Assistant:

int getMineshafts(int mc, uint64_t seed, int cx0, int cz0, int cx1, int cz1,
        Pos *out, int nout)
{
    uint64_t s;
    setSeed(&s, seed);
    uint64_t a = nextLong(&s);
    uint64_t b = nextLong(&s);
    int i, j;
    int n = 0;

    for (i = cx0; i <= cx1; i++)
    {
        uint64_t aix = i * a ^ seed;

        for (j = cz0; j <= cz1; j++)
        {
            setSeed(&s, aix ^ j * b);

            if (mc >= MC_1_13)
            {
                if unlikely(nextDouble(&s) < 0.004)
                {
                    if (out && n < nout)
                    {
                        out[n].x = i * 16;
                        out[n].z = j * 16;
                    }
                    n++;
                }
            }
            else
            {
                skipNextN(&s, 1);
                if unlikely(nextDouble(&s) < 0.004)
                {
                    int d = i;
                    if (-i > d) d = -i;
                    if (+j > d) d = +j;
                    if (-j > d) d = -j;
                    if (d >= 80 || nextInt(&s, 80) < d)
                    {
                        if (out && n < nout)
                        {
                            out[n].x = i * 16;
                            out[n].z = j * 16;
                        }
                        n++;
                    }
                }
            }
        }
    }